

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLimit::SetMin(ChLinkLimit *this,double val)

{
  double dVar1;
  
  this->m_min = val;
  if (this->m_max < val) {
    this->m_max = val;
  }
  dVar1 = this->m_max;
  if (dVar1 < val + this->m_minCushion) {
    this->m_minCushion = dVar1 - val;
  }
  if (dVar1 - this->m_maxCushion < this->m_minCushion + val) {
    this->m_maxCushion = (dVar1 - val) - this->m_minCushion;
  }
  (this->constr_lower).super_ChConstraintTwo.super_ChConstraint.active = true;
  return;
}

Assistant:

void ChLinkLimit::SetMin(double val) {
    m_min = val;
    if (m_min > m_max)
        m_max = m_min;
    if (m_min + m_minCushion > m_max)
        m_minCushion = m_max - m_min;
    if (m_min + m_minCushion > m_max - m_maxCushion)
        m_maxCushion = m_max - m_min - m_minCushion;
    constr_lower.SetActive(true);
}